

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::destroy_slots(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *this)

{
  bool bVar1;
  ctrl_t *pcVar2;
  size_t *psVar3;
  long *in_RDI;
  LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<std::__cxx11::basic_string<char>,_int>_>
  LVar4;
  Layout layout;
  size_t i;
  slot_type *in_stack_ffffffffffffffc8;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *in_stack_ffffffffffffffd0;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *alloc;
  
  if (in_RDI[3] != 0) {
    for (alloc = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  *)0x0;
        alloc != (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  *)in_RDI[3]; alloc = alloc + 1) {
      bVar1 = IsFull((ctrl_t)alloc[*in_RDI]);
      if (bVar1) {
        alloc_ref((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)0x1ca33e);
        hash_policy_traits<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,void>
        ::destroy<std::allocator<std::pair<std::__cxx11::string_const,int>>>
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
    }
    LVar4.size_ = (size_t  [2])MakeLayout(0x1ca378);
    SanitizerUnpoisonMemoryRegion((void *)in_RDI[1],in_RDI[3] * 0x28);
    alloc_ref((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)0x1ca3a2);
    internal_layout::
    LayoutImpl<std::tuple<signed_char,_phmap::container_internal::map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
    ::AllocSize(LVar4.size_[0]);
    Deallocate<8ul,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              (alloc,LVar4.size_[1],LVar4.size_[0]);
    pcVar2 = EmptyGroup();
    *in_RDI = (long)pcVar2;
    in_RDI[1] = 0;
    in_RDI[2] = 0;
    in_RDI[3] = 0;
    psVar3 = growth_left((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)0x1ca3fb);
    *psVar3 = 0;
  }
  return;
}

Assistant:

void destroy_slots() {
        if (!capacity_) return;
        for (size_t i = 0; i != capacity_; ++i) {
            if (IsFull(ctrl_[i])) {
                PolicyTraits::destroy(&alloc_ref(), slots_ + i);
            }
        }
        auto layout = MakeLayout(capacity_);
        // Unpoison before returning the memory to the allocator.
        SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
        Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
        ctrl_ = EmptyGroup();
        slots_ = nullptr;
        size_ = 0;
        capacity_ = 0;
        growth_left() = 0;
    }